

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

optional<unsigned_int> wasm::String::anon_unknown_0::takeWTF8CodePoint(string_view *str)

{
  long lVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar8 = str->_M_len;
  if (uVar8 != 0) {
    pbVar3 = (byte *)str->_M_str;
    bVar2 = *pbVar3;
    uVar9 = (uint)bVar2;
    bVar4 = true;
    if ((char)bVar2 < '\0') {
      if ((uVar9 & 0xffffffe0) == 0xc0) {
        uVar9 = (uVar9 & 0x1f) << 6;
        uVar5 = 1;
      }
      else if ((bVar2 & 0xf0) == 0xe0) {
        uVar9 = (uVar9 & 0xf) << 0xc;
        uVar5 = 2;
      }
      else if ((bVar2 & 0xf8) == 0xf0) {
        uVar9 = (uVar9 & 7) << 0x12;
        uVar5 = 3;
      }
      else {
        uVar9 = 0;
        uVar5 = 0;
        bVar4 = false;
      }
    }
    else {
      uVar5 = 0;
    }
    if (uVar5 < uVar8) {
      if (bVar4) {
        iVar6 = (int)uVar5 * 6;
        uVar7 = 0;
        do {
          iVar6 = iVar6 + -6;
          if (uVar5 == uVar7) break;
          uVar10 = pbVar3[uVar7 + 1] & 0xffffffc0;
          if (uVar10 == 0x80) {
            uVar9 = uVar9 | (pbVar3[uVar7 + 1] & 0x3f) << ((byte)iVar6 & 0x1f);
          }
          else {
            bVar4 = false;
          }
          uVar7 = uVar7 + 1;
        } while (uVar10 == 0x80);
      }
      lVar1 = uVar5 + 1;
      if (uVar8 <= uVar5) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   lVar1,uVar8);
      }
      str->_M_len = uVar8 - lVar1;
      str->_M_str = (char *)(pbVar3 + lVar1);
      if (bVar4) {
        if (uVar9 < 0x80) {
          uVar7 = 0;
        }
        else {
          uVar7 = 1;
          if ((0x7ff < uVar9) && (uVar7 = 2, 0xffff < uVar9)) {
            uVar7 = (ulong)(uVar9 < 0x110000) - 1 | 3;
          }
        }
        uVar8 = 0;
        if (uVar5 == uVar7) {
          uVar8 = (ulong)uVar9;
        }
        uVar5 = (ulong)(uVar5 == uVar7) << 0x20;
        goto LAB_00c3f3fe;
      }
    }
    else {
      str->_M_len = 0;
      str->_M_str = (char *)(pbVar3 + uVar8);
    }
  }
  uVar5 = 0;
  uVar8 = 0;
LAB_00c3f3fe:
  return (optional<unsigned_int>)(uVar5 | uVar8);
}

Assistant:

std::optional<uint32_t> takeWTF8CodePoint(std::string_view& str) {
  bool valid = true;

  if (str.size() == 0) {
    return std::nullopt;
  }

  uint8_t leading = str[0];
  size_t trailingBytes;
  // Initialized only to avoid spurious compiler warnings.
  uint32_t u = 0;
  if ((leading & 0b10000000) == 0b00000000) {
    // 0xxxxxxx
    trailingBytes = 0;
    u = leading;
  } else if ((leading & 0b11100000) == 0b11000000) {
    // 110xxxxx 10xxxxxx
    trailingBytes = 1;
    u = (leading & 0b00011111) << 6;
  } else if ((leading & 0b11110000) == 0b11100000) {
    // 1110xxxx 10xxxxxx 10xxxxxx
    trailingBytes = 2;
    u = (leading & 0b00001111) << 12;
  } else if ((leading & 0b11111000) == 0b11110000) {
    // 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
    trailingBytes = 3;
    u = (leading & 0b00000111) << 18;
  } else {
    // Bad WTF-8 leading byte.
    trailingBytes = 0;
    valid = false;
  }

  if (str.size() <= trailingBytes) {
    // Unexpected end of string.
    str = str.substr(str.size());
    return std::nullopt;
  }

  if (valid) {
    for (size_t j = 0; j < trailingBytes; ++j) {
      uint8_t trailing = str[1 + j];
      if ((trailing & 0b11000000) != 0b10000000) {
        // Bad WTF-8 trailing byte.
        valid = false;
        break;
      }
      // Shift 6 bits for every remaining trailing byte after this one.
      u |= (trailing & 0b00111111) << (6 * (trailingBytes - j - 1));
    }
  }

  str = str.substr(1 + trailingBytes);

  if (!valid) {
    return std::nullopt;
  }

  size_t expectedTrailing = u < 0x80       ? 0
                            : u < 0x800    ? 1
                            : u < 0x10000  ? 2
                            : u < 0x110000 ? 3
                                           : -1;
  if (trailingBytes != expectedTrailing) {
    // Overlong encoding or overlarge code point.
    return std::nullopt;
  }

  return u;
}